

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qopenglwidget.cpp
# Opt level: O0

void __thiscall QOpenGLWidgetPrivate::beginCompose(QOpenGLWidgetPrivate *this)

{
  QOpenGLWidgetPrivate *in_RDI;
  QOpenGLWidget *unaff_retaddr;
  QOpenGLWidget *q;
  
  q_func(in_RDI);
  if ((in_RDI->flushPending & 1U) != 0) {
    in_RDI->flushPending = false;
    QOpenGLWidget::makeCurrent(unaff_retaddr);
    QOpenGLContext::functions();
    QOpenGLExtensions::flushShared();
  }
  in_RDI->hasBeenComposed = true;
  QOpenGLWidget::aboutToCompose((QOpenGLWidget *)0x108132);
  return;
}

Assistant:

void QOpenGLWidgetPrivate::beginCompose()
{
    Q_Q(QOpenGLWidget);
    if (flushPending) {
        flushPending = false;
        q->makeCurrent();
        static_cast<QOpenGLExtensions *>(context->functions())->flushShared();
    }
    hasBeenComposed = true;
    emit q->aboutToCompose();
}